

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O0

void debugFindParent(DdManager *table,DdNode *node)

{
  uint uVar1;
  DdNode **ppDVar2;
  DdHalfWord local_40;
  DdNode *local_38;
  DdNode *f;
  DdNodePtr *nodelist;
  int local_20;
  int slots;
  int j;
  int i;
  DdNode *node_local;
  DdManager *table_local;
  
  slots = 0;
  while( true ) {
    if (node->index == 0x7fffffff) {
      local_40 = node->index;
    }
    else {
      local_40 = table->perm[node->index];
    }
    if ((int)local_40 <= slots) break;
    ppDVar2 = table->subtables[slots].nodelist;
    uVar1 = table->subtables[slots].slots;
    for (local_20 = 0; local_20 < (int)uVar1; local_20 = local_20 + 1) {
      for (local_38 = ppDVar2[local_20]; local_38 != (DdNode *)0x0; local_38 = local_38->next) {
        if (((local_38->type).kids.T == node) ||
           ((DdNode *)((ulong)(local_38->type).kids.E & 0xfffffffffffffffe) == node)) {
          fprintf((FILE *)table->out,
                  "parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",local_38,
                  (ulong)local_38->index,(ulong)local_38->ref,(local_38->type).value,
                  (local_38->type).kids.E);
        }
      }
    }
    slots = slots + 1;
  }
  return;
}

Assistant:

static void
debugFindParent(
  DdManager * table,
  DdNode * node)
{
    int         i,j;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;

    for (i = 0; i < cuddI(table,node->index); i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        for (j=0;j<slots;j++) {
            f = nodelist[j];
            while (f != NULL) {
                if (cuddT(f) == node || Cudd_Regular(cuddE(f)) == node) {
#if SIZEOF_VOID_P == 8
                    (void) fprintf(table->out,"parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
                    (void) fprintf(table->out,"parent is at 0x%x, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",
                        (ptruint)f,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
                }
                f = f->next;
            }
        }
    }

}